

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  Shape *pSVar1;
  char *in_RCX;
  string_view name;
  string_view name_00;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string_view local_120;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string_view local_e8;
  Shape *local_d8;
  Shape *c;
  char *local_c8;
  t_type_info<Circle> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  t_type_info<Square> local_68;
  undefined1 local_30 [8];
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  h;
  
  h.m_registered_types.
  super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::hierarchy((hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"sq");
  name._M_str = in_RCX;
  name._M_len = (size_t)local_78._M_str;
  trex::make_type_info<Square>(&local_68,(trex *)local_78._M_len,name);
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::register_type<Square>
            ((hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_30,&local_68);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&c,"ci");
  name_00._M_str = in_RCX;
  name_00._M_len = (size_t)local_c8;
  trex::make_type_info<Circle>(&local_c0,(trex *)c,name_00);
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::register_type<Circle>
            ((hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_30,&local_c0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"sq");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"asd",&local_109);
  pSVar1 = trex::
           hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::alloc_and_construct
                     ((hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_30,local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  local_d8 = pSVar1;
  (*pSVar1->_vptr_Shape[1])(pSVar1,&std::cout);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_120,"ci");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"cici",&local_141);
  local_d8 = trex::
             hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::alloc_and_construct
                       ((hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_30,local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  (*local_d8->_vptr_Shape[1])(local_d8,&std::cout);
  h.m_registered_types.
  super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~hierarchy((hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_30);
  return h.m_registered_types.
         super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
    trex::hierarchy<Shape, std::string> h;
    h.register_type(trex::make_type_info<Square>("sq"));
    h.register_type(trex::make_type_info<Circle>("ci"));

    auto c = h.alloc_and_construct("sq", "asd");
    c->log(std::cout);

    c = h.alloc_and_construct("ci", "cici");
    c->log(std::cout);

    return 0;
}